

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo_examples.cpp
# Opt level: O0

void density_tests::func(size_t i_size)

{
  size_t sVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  int *piVar4;
  undefined1 local_58 [8];
  lifo_array<int> other_numbers;
  void *mem;
  lifo_buffer buffer_2;
  lifo_buffer buffer_1;
  size_t i_size_local;
  
  density::lifo_buffer::lifo_buffer((lifo_buffer *)&buffer_2.m_size,i_size);
  sVar1 = density::lifo_buffer::size((lifo_buffer *)&buffer_2.m_size);
  if (sVar1 != i_size) {
    __assert_fail("buffer_1.size() == i_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lifo_examples.cpp"
                  ,0x2c,"void density_tests::func(size_t)");
  }
  density::lifo_buffer::lifo_buffer((lifo_buffer *)&mem);
  sVar1 = density::lifo_buffer::size((lifo_buffer *)&mem);
  if (sVar1 != 0) {
    __assert_fail("buffer_2.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lifo_examples.cpp"
                  ,0x2f,"void density_tests::func(size_t)");
  }
  puVar2 = (undefined4 *)density::lifo_buffer::resize((lifo_buffer *)&mem,4);
  puVar3 = (undefined4 *)density::lifo_buffer::data((lifo_buffer *)&mem);
  if (puVar2 != puVar3) {
    __assert_fail("mem == buffer_2.data()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lifo_examples.cpp"
                  ,0x32,"void density_tests::func(size_t)");
  }
  *puVar2 = 5;
  piVar4 = (int *)density::lifo_buffer::resize((lifo_buffer *)&mem,0x50);
  if (*piVar4 == 5) {
    density::lifo_array<int>::lifo_array((lifo_array<int> *)local_58,7);
    density::lifo_array<int>::~lifo_array((lifo_array<int> *)local_58);
    density::lifo_buffer::~lifo_buffer((lifo_buffer *)&mem);
    density::lifo_buffer::~lifo_buffer((lifo_buffer *)&buffer_2.m_size);
    return;
  }
  __assert_fail("*static_cast<int *>(mem) == 5",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lifo_examples.cpp"
                ,0x36,"void density_tests::func(size_t)");
}

Assistant:

void func(size_t i_size)
    {
        using namespace density;

        lifo_buffer buffer_1(i_size);
        assert(buffer_1.size() == i_size);

        lifo_buffer buffer_2; // now buffer_1 can't be resized until buffer_2 is destroyed
        assert(buffer_2.size() == 0);

        auto mem = buffer_2.resize(sizeof(int));
        assert(mem == buffer_2.data());
        *static_cast<int *>(mem) = 5;

        mem = buffer_2.resize(sizeof(int) * 20);
        assert(*static_cast<int *>(mem) == 5);

        lifo_array<int> other_numbers(7);
        // buffer_2.resize(20); <---- violation of the lifo constraint, other_numbers is more recent!
    }